

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64 __thiscall google::protobuf::internal::SerialArena::SpaceUsed(SerialArena *this)

{
  char *pcVar1;
  char *pcVar2;
  ulong *puVar3;
  long lVar5;
  ulong uVar4;
  
  pcVar1 = this->ptr_;
  pcVar2 = Block::Pointer(this->head_,0x18);
  lVar5 = (long)pcVar1 - (long)pcVar2;
  uVar4 = this->head_->next_and_bits_;
  while (puVar3 = (ulong *)(uVar4 & 0xfffffffffffffffc), puVar3 != (ulong *)0x0) {
    lVar5 = lVar5 + puVar3[1] + -0x18;
    uVar4 = *puVar3;
  }
  return lVar5 - 0x48;
}

Assistant:

uint64 SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= ArenaImpl::kSerialArenaSize;
  return space_used;
}